

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O1

void sbfDeque_pushFront(sbfDeque dq,void *vp)

{
  u_int *puVar1;
  sbfSpinLock *__lock;
  sbfPool psVar2;
  sbfPoolItemImpl *psVar3;
  sbfDequeItemImpl *psVar4;
  
  psVar2 = dq->mPool;
  LOCK();
  puVar1 = &psVar2->mCount->mGets;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  __lock = &psVar2->mLock;
  pthread_spin_lock(__lock);
  psVar3 = psVar2->mAvailable;
  if (psVar3 == (sbfPoolItemImpl *)0x0) {
    LOCK();
    psVar3 = psVar2->mFree;
    psVar2->mFree = (sbfPoolItemImpl *)0x0;
    UNLOCK();
  }
  if (psVar3 == (sbfPoolItemImpl *)0x0) {
    pthread_spin_unlock(__lock);
    LOCK();
    puVar1 = &psVar2->mCount->mNews;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    psVar3 = (sbfPoolItemImpl *)sbfMemory_malloc(psVar2->mSize);
    psVar3->mPool = psVar2;
    psVar3->mNext = (sbfPoolItemImpl *)0x0;
  }
  else {
    psVar2->mAvailable = psVar3->mNext;
    pthread_spin_unlock(__lock);
  }
  psVar3[1].mPool = (sbfPool)vp;
  psVar4 = (dq->mList).tqh_first;
  psVar3[1].mNext = (sbfPoolItemImpl *)psVar4;
  if (psVar4 == (sbfDequeItemImpl *)0x0) {
    psVar4 = (sbfDequeItemImpl *)dq;
  }
  (psVar4->mListEntry).tqe_prev = (sbfDequeItemImpl **)&psVar3[1].mNext;
  (dq->mList).tqh_first = (sbfDequeItemImpl *)(psVar3 + 1);
  psVar3[2].mPool = (sbfPool)&dq->mList;
  return;
}

Assistant:

void
sbfDeque_pushFront (sbfDeque dq, void* vp)
{
    sbfDequeItem dqe;

    dqe = sbfPool_get (dq->mPool);
    dqe->mPointer = vp;
    TAILQ_INSERT_HEAD (&dq->mList, dqe, mListEntry);
}